

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall Assimp::ColladaLoader::StoreSceneTextures(ColladaLoader *this,aiScene *pScene)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  aiTexture **ppaVar5;
  iterator __first;
  iterator __last;
  aiScene *pScene_local;
  ColladaLoader *this_local;
  
  sVar3 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::size(&this->mTextures);
  pScene->mNumTextures = (uint)sVar3;
  bVar2 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::empty(&this->mTextures);
  if (!bVar2) {
    sVar3 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::size(&this->mTextures);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiTexture **)operator_new__(uVar4);
    pScene->mTextures = ppaVar5;
    __first = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::begin(&this->mTextures);
    __last = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::end(&this->mTextures);
    std::
    copy<__gnu_cxx::__normal_iterator<aiTexture**,std::vector<aiTexture*,std::allocator<aiTexture*>>>,aiTexture**>
              ((__normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>
                )__first._M_current,
               (__normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>
                )__last._M_current,pScene->mTextures);
    std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::clear(&this->mTextures);
  }
  return;
}

Assistant:

void ColladaLoader::StoreSceneTextures( aiScene* pScene) {
    pScene->mNumTextures = static_cast<unsigned int>(mTextures.size());
    if( mTextures.empty() ) {
        return;
    }
    pScene->mTextures = new aiTexture*[mTextures.size()];
    std::copy( mTextures.begin(), mTextures.end(), pScene->mTextures);
    mTextures.clear();
}